

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_archive.hpp
# Opt level: O0

result_type __thiscall
pstore::serialize::archive::details::database_writer_policy::
putn<pstore::gsl::span<unsigned_long_const,2l>>
          (database_writer_policy *this,span<const_unsigned_long,_2L> sp)

{
  transaction_base *this_00;
  type num;
  element_type *__result;
  span_iterator<pstore::gsl::span<const_unsigned_long,_2L>,_false> local_98;
  span_iterator<pstore::gsl::span<const_unsigned_long,_2L>,_false> local_88;
  tuple<std::shared_ptr<unsigned_long>&,pstore::typed_address<unsigned_long>&> local_78 [32];
  index_type local_58;
  pair<std::shared_ptr<unsigned_long>,_pstore::typed_address<unsigned_long>_> local_50;
  typed_address<unsigned_long> local_38;
  typed_address<unsigned_long> addr;
  shared_ptr<unsigned_long> ptr;
  database_writer_policy *this_local;
  span<const_unsigned_long,_2L> sp_local;
  
  this_local = (database_writer_policy *)sp.storage_.data_;
  std::shared_ptr<unsigned_long>::shared_ptr((shared_ptr<unsigned_long> *)&addr);
  local_38 = typed_address<unsigned_long>::null();
  this_00 = this->transaction_;
  local_58 = gsl::span<const_unsigned_long,_2L>::size((span<const_unsigned_long,_2L> *)&this_local);
  num = unsigned_cast<long>(&local_58);
  transaction_base::alloc_rw<unsigned_long,void>(&local_50,this_00,num);
  std::tie<std::shared_ptr<unsigned_long>,pstore::typed_address<unsigned_long>>
            ((shared_ptr<unsigned_long> *)local_78,&addr);
  std::tuple<std::shared_ptr<unsigned_long>&,pstore::typed_address<unsigned_long>&>::operator=
            (local_78,&local_50);
  std::pair<std::shared_ptr<unsigned_long>,_pstore::typed_address<unsigned_long>_>::~pair(&local_50)
  ;
  std::begin<pstore::gsl::span<unsigned_long_const,2l>>((span<const_unsigned_long,_2L> *)&local_88);
  std::end<pstore::gsl::span<unsigned_long_const,2l>>((span<const_unsigned_long,_2L> *)&local_98);
  __result = std::__shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2> *)&addr);
  std::
  copy<pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_long_const,2l>,false>,unsigned_long*>
            (&local_88,&local_98,__result);
  sp_local.storage_.data_ =
       (storage_type<pstore::gsl::details::extent_type<2L>_>)
       typed_address<unsigned_long>::to_address(&local_38);
  std::shared_ptr<unsigned_long>::~shared_ptr((shared_ptr<unsigned_long> *)&addr);
  return (result_type)(value_type)sp_local.storage_.data_;
}

Assistant:

auto putn (Span sp) -> result_type {
                        using element_type =
                            typename std::remove_const<typename Span::element_type>::type;

                        std::shared_ptr<element_type> ptr;
                        auto addr = typed_address<element_type>::null ();
                        std::tie (ptr, addr) = transaction_.template alloc_rw<element_type> (
                            unsigned_cast (sp.size ()));
                        std::copy (std::begin (sp), std::end (sp), ptr.get ());
                        return addr.to_address ();
                    }